

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

FiniteAutomaton *
Omega_h::FiniteAutomaton::concat
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *a,FiniteAutomaton *b,int token)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int i;
  int i_1;
  
  iVar4 = (a->table).ncols;
  bVar1 = a->is_deterministic;
  iVar2 = get_nrows<int>(&a->table);
  iVar3 = get_nrows<int>(&b->table);
  FiniteAutomaton(__return_storage_ptr__,iVar4 + (uint)bVar1 * 2 + -2,false,iVar2 + iVar3);
  append_states(__return_storage_ptr__,a);
  iVar4 = get_nrows<int>(&__return_storage_ptr__->table);
  append_states(__return_storage_ptr__,b);
  iVar2 = get_epsilon0(__return_storage_ptr__);
  iVar3 = 0;
  while( true ) {
    iVar5 = get_nrows<int>(&a->table);
    if (iVar5 <= iVar3) break;
    iVar5 = accepts(a,iVar3);
    if (iVar5 != -1) {
      add_transition(__return_storage_ptr__,iVar3,iVar2,iVar4);
      remove_accept(__return_storage_ptr__,iVar3);
    }
    iVar3 = iVar3 + 1;
  }
  iVar2 = 0;
  while( true ) {
    iVar3 = get_nrows<int>(&b->table);
    if (iVar3 <= iVar2) break;
    iVar3 = accepts(b,iVar2);
    if (iVar3 != -1) {
      add_accept(__return_storage_ptr__,iVar4 + iVar2,token);
    }
    iVar2 = iVar2 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::concat(
    FiniteAutomaton const& a, FiniteAutomaton const& b, int token) {
  auto nsymbols = get_nsymbols(a);
  FiniteAutomaton out(nsymbols, false, get_nstates(a) + get_nstates(b));
  append_states(out, a);
  auto b_offset = get_nstates(out);
  append_states(out, b);
  auto epsilon0 = get_epsilon0(out);
  for (int i = 0; i < get_nstates(a); ++i) {
    if (accepts(a, i) != -1) {
      add_transition(out, i, epsilon0, b_offset);
      remove_accept(out, i);
    }
  }
  for (int i = 0; i < get_nstates(b); ++i) {
    if (accepts(b, i) != -1) {
      add_accept(out, i + b_offset, token);
    }
  }
  return out;
}